

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

int __thiscall rw::ColorQuant::init(ColorQuant *this,EVP_PKEY_CTX *ctx)

{
  Node *pNVar1;
  ColorQuant *this_local;
  
  LinkList::init(&this->leaves,ctx);
  pNVar1 = createNode(this,8);
  this->root = pNVar1;
  return (int)this;
}

Assistant:

void
ColorQuant::init(void)
{
	this->leaves.init();
	this->root = this->createNode(QUANTDEPTH);
}